

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cpp
# Opt level: O3

ggml_threadpool_params *
ggml_threadpool_params_from_cpu_params
          (ggml_threadpool_params *__return_storage_ptr__,cpu_params *params)

{
  ggml_threadpool_params_init(__return_storage_ptr__,params->n_threads);
  if (params->mask_valid == true) {
    memcpy(__return_storage_ptr__,params->cpumask,0x200);
  }
  __return_storage_ptr__->prio = params->priority;
  __return_storage_ptr__->poll = params->poll;
  __return_storage_ptr__->strict_cpu = params->strict_cpu;
  return __return_storage_ptr__;
}

Assistant:

struct ggml_threadpool_params ggml_threadpool_params_from_cpu_params(const cpu_params & params) {
    struct ggml_threadpool_params tpp;

    ggml_threadpool_params_init(&tpp, params.n_threads); // setup the defaults

    if (params.mask_valid) {
        std::memcpy(&tpp.cpumask, &params.cpumask, GGML_MAX_N_THREADS);
    }

    tpp.prio       = params.priority;
    tpp.poll       = params.poll;
    tpp.strict_cpu = params.strict_cpu;

    return tpp;
}